

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void __thiscall
pbrt::
TaggedPointer<pbrt::HomogeneousMedium,pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,pbrt::GeneralMedium<pbrt::CloudMediumProvider>,pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>>
::TaggedPointer<pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>const>
          (TaggedPointer<pbrt::HomogeneousMedium,pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,pbrt::GeneralMedium<pbrt::CloudMediumProvider>,pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>>
           *this,GeneralMedium<pbrt::NanoVDBMediumProvider> *ptr)

{
  uint16_t type;
  uintptr_t iptr;
  GeneralMedium<pbrt::NanoVDBMediumProvider> *ptr_local;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  *this_local;
  
  *(undefined8 *)this = 0;
  *(ulong *)this = (ulong)ptr | 0x4000000000000;
  return;
}

Assistant:

PBRT_CPU_GPU TaggedPointer(T *ptr) {
        uintptr_t iptr = reinterpret_cast<uintptr_t>(ptr);
        // Reminder: if this CHECK hits, it's likely that the class
        // involved needs an alignas(8).
        DCHECK_EQ(iptr & ptrMask, iptr);
        constexpr uint16_t type = TypeIndex<T>();
        bits = iptr | ((uintptr_t)type << tagShift);
    }